

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yprintf.c
# Opt level: O3

void yprintf(ParamOutputLv level,char *format,...)

{
  char in_AL;
  ParamOutputLv PVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  PVar1 = output_lv();
  if (level <= PVar1) {
    iVar2 = isatty(2);
    if ((iVar2 != 0) && ((level == OUTPUT_LV_ERROR || (level == OUTPUT_LV_WARNING)))) {
      yprintf_cold_1();
    }
    local_d8 = local_c8;
    local_e0 = &ap[0].overflow_arg_area;
    local_e8 = 0x3000000010;
    vfprintf(_stderr,format,&local_e8);
    iVar2 = isatty(2);
    if (iVar2 != 0) {
      yprintf_cold_2();
    }
    fflush(_stderr);
  }
  return;
}

Assistant:

void yprintf(ParamOutputLv level, const char* format, ...)
{
  va_list ap;

  if (output_lv() < level)
    return;

#if !defined(__MINGW32__)
  if (isatty(2))
  {
    switch (level)
    {
      case OUTPUT_LV_ERROR:
        fputs("\x1B[0;31m", stderr);
        break;
      case OUTPUT_LV_WARNING:
        fputs("\x1B[0;33m", stderr);
        break;
      default:
        break;
    }
  }
#endif  // !defined(__MINGW32__)

  va_start(ap, format);
  vfprintf(stderr, format, ap);
  va_end(ap);

#if !defined(__MINGW32__)
  if (isatty(2))
    fputs("\x1B[0m", stderr);
#endif  // !defined(__MINGW32__)

  fflush(stderr);
}